

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::getDualObjectiveValue(Highs *this,double *dual_objective_function_value)

{
  bool bVar1;
  
  if ((this->model_).hessian_.dim_ != 0) {
    return kError;
  }
  bVar1 = computeDualObjectiveValue
                    (&(this->model_).lp_,&this->solution_,dual_objective_function_value);
  return (uint)bVar1 + kError;
}

Assistant:

HighsStatus Highs::getDualObjectiveValue(
    double& dual_objective_function_value) const {
  bool have_dual_objective_value = false;
  if (!this->model_.isQp())
    have_dual_objective_value = computeDualObjectiveValue(
        model_.lp_, solution_, dual_objective_function_value);
  return have_dual_objective_value ? HighsStatus::kOk : HighsStatus::kError;
}